

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void do_fmla_zpzzz_s(CPUARMState_conflict *env,void *vg,uint32_t desc,uint32_t neg1,uint32_t neg3)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  float32 fVar6;
  float32 r;
  float32 e3;
  float32 e2;
  float32 e1;
  uint64_t pg;
  uint64_t *g;
  void *va;
  void *vm;
  void *vn;
  void *vd;
  uint ra;
  uint rm;
  uint rn;
  uint rd;
  intptr_t i;
  uint32_t neg3_local;
  uint32_t neg1_local;
  uint32_t desc_local;
  void *vg_local;
  CPUARMState_conflict *env_local;
  
  _rn = simd_oprsz(desc);
  uVar2 = extract32(desc,10,5);
  uVar3 = extract32(desc,0xf,5);
  uVar4 = extract32(desc,0x14,5);
  uVar5 = extract32(desc,0x19,5);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(_rn - 1) >> 6) * 8);
    do {
      _rn = _rn - 4;
      if ((uVar1 >> ((byte)_rn & 0x3f) & 1) != 0) {
        fVar6 = float32_muladd_aarch64
                          (*(uint *)((long)(env->vfp).zregs[uVar3].d + _rn) ^ neg1,
                           *(float32 *)((long)(env->vfp).zregs[uVar4].d + _rn),
                           *(uint *)((long)(env->vfp).zregs[uVar5].d + _rn) ^ neg3,0,
                           &(env->vfp).fp_status);
        *(float32 *)((long)(env->vfp).zregs[uVar2].d + _rn) = fVar6;
      }
    } while ((_rn & 0x3f) != 0);
  } while (_rn != 0);
  return;
}

Assistant:

static void do_fmla_zpzzz_s(CPUARMState *env, void *vg, uint32_t desc,
                            uint32_t neg1, uint32_t neg3)
{
    intptr_t i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            i -= 4;
            if (likely((pg >> (i & 63)) & 1)) {
                float32 e1, e2, e3, r;

                e1 = *(uint32_t *)((char *)vn + H1_4(i)) ^ neg1;
                e2 = *(uint32_t *)((char *)vm + H1_4(i));
                e3 = *(uint32_t *)((char *)va + H1_4(i)) ^ neg3;
                r = float32_muladd(e1, e2, e3, 0, &env->vfp.fp_status);
                *(uint32_t *)((char *)vd + H1_4(i)) = r;
            }
        } while (i & 63);
    } while (i != 0);
}